

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O3

void __thiscall
SemanticAnalyzerRun::onEnterLiteralExpressionAstNode
          (SemanticAnalyzerRun *this,LiteralExpressionAstNode *node)

{
  uint *puVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint uVar4;
  element_type *peVar5;
  string local_58;
  SemanticAnalyzerRun *local_38;
  
  peVar5 = (node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar5->tokenType == IntegerLiteral) goto LAB_00110b12;
  if (peVar5->tokenType != FloatLiteral) {
    return;
  }
  local_38 = this;
  puVar1 = (uint *)__errno_location();
  do {
    pcVar3 = (peVar5->value)._M_dataplus._M_p;
    uVar4 = *puVar1;
    peVar5 = (element_type *)(ulong)uVar4;
    *puVar1 = 0;
    strtod(pcVar3,(char **)&local_58);
    if (local_58._M_dataplus._M_p == pcVar3) {
      std::__throw_invalid_argument("stod");
    }
    else {
      if (*puVar1 == 0) goto LAB_00110b5c;
      if (*puVar1 != 0x22) {
        return;
      }
      pcVar3 = "stod";
      std::__throw_out_of_range("stod");
      this = (SemanticAnalyzerRun *)pcVar3;
LAB_00110b12:
      pcVar3 = (peVar5->value)._M_dataplus._M_p;
      local_38 = this;
      puVar1 = (uint *)__errno_location();
      uVar4 = *puVar1;
      *puVar1 = 0;
      strtoll(pcVar3,(char **)&local_58,10);
      if (local_58._M_dataplus._M_p != pcVar3) {
        if (*puVar1 != 0) {
          if (*puVar1 != 0x22) {
            return;
          }
          std::__throw_out_of_range("stoll");
        }
LAB_00110b5c:
        *puVar1 = uVar4;
        return;
      }
    }
    uVar2 = std::__throw_invalid_argument("stoll");
    if (*puVar1 == 0) {
      *puVar1 = uVar4;
    }
    __cxa_begin_catch(uVar2);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Invalid value for integer literal.","");
    reportError(local_38,&node->token,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    __cxa_end_catch();
    peVar5 = (node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  } while( true );
}

Assistant:

void onEnterLiteralExpressionAstNode(LiteralExpressionAstNode* node) noexcept override {
    switch (node->token->tokenType) {
      case TokenType::IntegerLiteral: {
        try {
          std::stoll(node->token->value);
          return;
        } catch (...) {
          this->reportError(node->token, "Invalid value for integer literal.");
        }
      }
      case TokenType::FloatLiteral: {
        try {
          std::stod(node->token->value);
          return;
        } catch (...) {
          this->reportError(node->token, "Invalid value for float literal.");
        }
      }
      default:
        return;
    }
  }